

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall
ASN1Test_OptionalAndDefaultBooleans_Test::TestBody(ASN1Test_OptionalAndDefaultBooleans_Test *this)

{
  bool bVar1;
  BOOLEANS *pBVar2;
  char *pcVar3;
  pointer pBVar4;
  char *in_R9;
  AssertHelper local_330;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_12;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_11;
  Message local_2d8;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_10;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_270;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_240;
  Message local_238;
  int local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_8;
  Message local_210;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_7;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_6;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  uint8_t *der;
  AssertHelper local_148;
  Message local_140;
  int local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  _func_void_BOOLEANS_ptr *local_28;
  undefined1 local_20 [8];
  unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> obj;
  ASN1Test_OptionalAndDefaultBooleans_Test *this_local;
  
  local_28 = BOOLEANS_free;
  obj._M_t.super___uniq_ptr_impl<BOOLEANS,_void_(*)(BOOLEANS_*)>._M_t.
  super__Tuple_impl<0UL,_BOOLEANS_*,_void_(*)(BOOLEANS_*)>.super__Head_base<0UL,_BOOLEANS_*,_false>.
  _M_head_impl = (BOOLEANS *)this;
  std::unique_ptr<BOOLEANS,void(*)(BOOLEANS*)>::unique_ptr<void(*)(BOOLEANS*),void>
            ((unique_ptr<BOOLEANS,void(*)(BOOLEANS*)> *)local_20,(pointer)0x0,&local_28);
  pBVar2 = BOOLEANS_new();
  std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::reset
            ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20,pBVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<BOOLEANS,void(*)(BOOLEANS*)>>
            ((AssertionResult *)local_48,(unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_48,(AssertionResult *)0x8733ab,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xad5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    local_94 = -1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_90,"obj->required","(-1)",&pBVar4->required,&local_94);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xad6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    local_bc = -1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_b8,"obj->optional","(-1)",&pBVar4->optional,&local_bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xad7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    local_e4 = 0xff;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e0,"obj->default_true","0xff",&pBVar4->default_true,&local_e4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xad8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    local_10c = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_108,"obj->default_false","0",&pBVar4->default_false,&local_10c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xad9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    local_138[1] = 0xffffffff;
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::get
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    local_138[0] = i2d_BOOLEANS(pBVar4,(uchar **)0x0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_130,"-1","i2d_BOOLEANS(obj.get(), nullptr)",local_138 + 1,local_138
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xadc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    pBVar4->required = 0;
    pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::get
                       ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
    bssl::Span<unsigned_char_const>::Span<5ul>
              ((Span<unsigned_char_const> *)&der,(uchar (*) [5])"0\x03\x01\x01");
    TestSerialize<BOOLEANS*,BOOLEANS*>(pBVar4,i2d_BOOLEANS,_der);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )TestBody::kFieldsOmitted;
    pBVar2 = d2i_BOOLEANS((BOOLEANS **)0x0,(uchar **)&gtest_ar__1.message_,5);
    std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::reset
              ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20,pBVar2);
    testing::AssertionResult::AssertionResult<std::unique_ptr<BOOLEANS,void(*)(BOOLEANS*)>>
              ((AssertionResult *)local_170,(unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_5.message_,(internal *)local_170,(AssertionResult *)0x8733ab,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xae6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_178);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      local_1b4 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1b0,"obj->required","0",&pBVar4->required,&local_1b4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xae7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      local_1dc = -1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1d8,"obj->optional","(-1)",&pBVar4->optional,&local_1dc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xae8,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      local_204 = 0xff;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_200,"obj->default_true","0xff",&pBVar4->default_true,&local_204);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xae9,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_210);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_210);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      local_22c = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_228,"obj->default_false","0",&pBVar4->default_false,&local_22c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xaea,pcVar3);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      pBVar4->required = 0xff;
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      pBVar4->optional = 0;
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      pBVar4->default_true = 0;
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      pBVar4->default_false = 0xff;
      pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::get
                         ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
      bssl::Span<unsigned_char_const>::Span<14ul>
                ((Span<unsigned_char_const> *)&gtest_ar__2.message_,&TestBody::kFieldsIncluded);
      TestSerialize<BOOLEANS*,BOOLEANS*>(pBVar4,i2d_BOOLEANS,stack0xfffffffffffffdb0);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )TestBody::kFieldsIncluded;
      pBVar2 = d2i_BOOLEANS((BOOLEANS **)0x0,(uchar **)&gtest_ar__1.message_,0xe);
      std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::reset
                ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20,pBVar2);
      testing::AssertionResult::AssertionResult<std::unique_ptr<BOOLEANS,void(*)(BOOLEANS*)>>
                ((AssertionResult *)local_260,(unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20
                 ,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
      if (!bVar1) {
        testing::Message::Message(&local_268);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_9.message_,(internal *)local_260,(AssertionResult *)0x8733ab,
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xaf8,pcVar3);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_268);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                           ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
        local_2a4 = 0xff;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_2a0,"obj->required","0xff",&pBVar4->required,&local_2a4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
        if (!bVar1) {
          testing::Message::Message(&local_2b0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xaf9,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_2b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_2b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
        pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                           ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
        local_2cc = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_2c8,"obj->optional","0",&pBVar4->optional,&local_2cc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
        if (!bVar1) {
          testing::Message::Message(&local_2d8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xafa,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_2d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
        pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                           ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
        local_2f4 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_2f0,"obj->default_true","0",&pBVar4->default_true,&local_2f4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
        if (!bVar1) {
          testing::Message::Message(&local_300);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xafb,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,&local_300);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_300);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
        pBVar4 = std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::operator->
                           ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
        local_31c = 0xff;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_318,"obj->default_false","0xff",&pBVar4->default_false,
                   &local_31c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
        if (!bVar1) {
          testing::Message::Message(&local_328);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
          testing::internal::AssertHelper::AssertHelper
                    (&local_330,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xafc,pcVar3);
          testing::internal::AssertHelper::operator=(&local_330,&local_328);
          testing::internal::AssertHelper::~AssertHelper(&local_330);
          testing::Message::~Message(&local_328);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  std::unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)>::~unique_ptr
            ((unique_ptr<BOOLEANS,_void_(*)(BOOLEANS_*)> *)local_20);
  return;
}

Assistant:

TEST(ASN1Test, OptionalAndDefaultBooleans) {
  std::unique_ptr<BOOLEANS, decltype(&BOOLEANS_free)> obj(nullptr,
                                                          BOOLEANS_free);

  // A default-constructed object should use, respectively, omitted, omitted,
  // TRUE, FALSE.
  //
  // TODO(davidben): Is the first one a bug? It seems more consistent for a
  // required BOOLEAN default to FALSE. |FOO_new| typically default-initializes
  // fields valid states. (Though there are exceptions. CHOICE, ANY, and OBJECT
  // IDENTIFIER are default-initialized to something invalid.)
  obj.reset(BOOLEANS_new());
  ASSERT_TRUE(obj);
  EXPECT_EQ(obj->required, ASN1_BOOLEAN_NONE);
  EXPECT_EQ(obj->optional, ASN1_BOOLEAN_NONE);
  EXPECT_EQ(obj->default_true, ASN1_BOOLEAN_TRUE);
  EXPECT_EQ(obj->default_false, ASN1_BOOLEAN_FALSE);

  // Trying to serialize this should fail, because |obj->required| is omitted.
  EXPECT_EQ(-1, i2d_BOOLEANS(obj.get(), nullptr));

  // Otherwise, this object is serializable. Most fields are omitted, due to
  // them being optional or defaulted.
  static const uint8_t kFieldsOmitted[] = {0x30, 0x03, 0x01, 0x01, 0x00};
  obj->required = 0;
  TestSerialize(obj.get(), i2d_BOOLEANS, kFieldsOmitted);

  const uint8_t *der = kFieldsOmitted;
  obj.reset(d2i_BOOLEANS(nullptr, &der, sizeof(kFieldsOmitted)));
  ASSERT_TRUE(obj);
  EXPECT_EQ(obj->required, ASN1_BOOLEAN_FALSE);
  EXPECT_EQ(obj->optional, ASN1_BOOLEAN_NONE);
  EXPECT_EQ(obj->default_true, ASN1_BOOLEAN_TRUE);
  EXPECT_EQ(obj->default_false, ASN1_BOOLEAN_FALSE);

  // Include the optinonal fields instead.
  static const uint8_t kFieldsIncluded[] = {0x30, 0x0c, 0x01, 0x01, 0xff,
                                            0x81, 0x01, 0x00, 0x82, 0x01,
                                            0x00, 0x83, 0x01, 0xff};
  obj->required = ASN1_BOOLEAN_TRUE;
  obj->optional = ASN1_BOOLEAN_FALSE;
  obj->default_true = ASN1_BOOLEAN_FALSE;
  obj->default_false = ASN1_BOOLEAN_TRUE;
  TestSerialize(obj.get(), i2d_BOOLEANS, kFieldsIncluded);

  der = kFieldsIncluded;
  obj.reset(d2i_BOOLEANS(nullptr, &der, sizeof(kFieldsIncluded)));
  ASSERT_TRUE(obj);
  EXPECT_EQ(obj->required, ASN1_BOOLEAN_TRUE);
  EXPECT_EQ(obj->optional, ASN1_BOOLEAN_FALSE);
  EXPECT_EQ(obj->default_true, ASN1_BOOLEAN_FALSE);
  EXPECT_EQ(obj->default_false, ASN1_BOOLEAN_TRUE);

  // TODO(https://crbug.com/boringssl/354): Reject explicit DEFAULTs.
}